

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

string * helics::newDestGeneration
                   (string *__return_storage_ptr__,string *src,string *dest,string *formula)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  regex destreg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  regex srcreg;
  
  sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)formula,
                     '$',0);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)formula);
  }
  else {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&srcreg,"\\$\\{source\\}",0x10);
    std::__cxx11::string::string
              ((string *)&local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src);
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&destreg,formula
               ,&srcreg,&local_a0,0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)formula,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&destreg);
    std::__cxx11::string::~string((string *)&destreg);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&destreg,"\\$\\{dest\\}",0x10);
    std::__cxx11::string::string
              ((string *)&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dest);
    std::
    regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>,std::char_traits<char>,std::allocator<char>>
              (&local_a0,formula,&destreg,&local_60,0);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)formula,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)formula);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&destreg);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&srcreg);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string newDestGeneration(const std::string& src, const std::string& dest, std::string formula)
{
    if (formula.find_first_of('$') == std::string::npos) {
        return formula;
    }
    const std::regex srcreg(R"(\$\{source\})");
    formula = std::regex_replace(formula, srcreg, std::string{src});
    const std::regex destreg(R"(\$\{dest\})");
    formula = std::regex_replace(formula, destreg, std::string{dest});
    return formula;
}